

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

Triangle * __thiscall
p2t::Sweep::NextFlipTriangle
          (Sweep *this,SweepContext *tcx,int o,Triangle *t,Triangle *ot,Point *p,Point *op)

{
  int iVar1;
  int edge_index;
  int edge_index_1;
  Point *p_local;
  Triangle *ot_local;
  Triangle *t_local;
  int o_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  if (o == 1) {
    iVar1 = Triangle::EdgeIndex(ot,p,op);
    ot->delaunay_edge[iVar1] = true;
    Legalize(this,tcx,ot);
    Triangle::ClearDelunayEdges(ot);
    this_local = (Sweep *)t;
  }
  else {
    iVar1 = Triangle::EdgeIndex(t,p,op);
    t->delaunay_edge[iVar1] = true;
    Legalize(this,tcx,t);
    Triangle::ClearDelunayEdges(t);
    this_local = (Sweep *)ot;
  }
  return (Triangle *)this_local;
}

Assistant:

Triangle& Sweep::NextFlipTriangle(SweepContext& tcx, int o, Triangle& t, Triangle& ot, Point& p, Point& op)
{
  if (o == CCW) {
    // ot is not crossing edge after flip
    int edge_index = ot.EdgeIndex(&p, &op);
    ot.delaunay_edge[edge_index] = true;
    Legalize(tcx, ot);
    ot.ClearDelunayEdges();
    return t;
  }

  // t is not crossing edge after flip
  int edge_index = t.EdgeIndex(&p, &op);

  t.delaunay_edge[edge_index] = true;
  Legalize(tcx, t);
  t.ClearDelunayEdges();
  return ot;
}